

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall cmCTest::CTestFileExists(cmCTest *this,string *filename)

{
  bool bVar1;
  string testingDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,&this->BinaryDir,"/Testing/");
  std::operator+(&bStack_98,&local_38,&this->CurrentTag);
  std::operator+(&local_78,&bStack_98,"/");
  std::operator+(&local_58,&local_78,filename);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  bVar1 = cmsys::SystemTools::FileExists(local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  return bVar1;
}

Assistant:

bool cmCTest::CTestFileExists(const std::string& filename)
{
  std::string testingDir =
    this->BinaryDir + "/Testing/" + this->CurrentTag + "/" + filename;
  return cmSystemTools::FileExists(testingDir.c_str());
}